

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O2

bool __thiscall ZXing::BitMatrix::get(BitMatrix *this,int x,int y)

{
  data_t *pdVar1;
  
  pdVar1 = get(this,x + y * this->_width);
  return *pdVar1 != '\0';
}

Assistant:

bool get(int x, int y) const { return get(y * _width + x); }